

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

int sysbvm_type_computeDepth(sysbvm_tuple_t type)

{
  int iVar1;
  int iVar2;
  
  if (type == 0) {
    return -1;
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = iVar1;
    if ((type & 0xf) != 0) {
      return iVar2;
    }
    if ((*(byte *)(type + 8) & 0x80) != 0) break;
    type = *(ulong *)(type + 0x30);
    iVar1 = iVar2 + 1;
    if (type == 0) {
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

SYSBVM_API int sysbvm_type_computeDepth(sysbvm_tuple_t type)
{
    if(!type)
        return -1;

    return sysbvm_type_computeDepth(sysbvm_type_getSupertype(type)) + 1;
}